

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<unsigned_short,unsigned_short,duckdb::GreaterThan,false,true>
                (unsigned_short *ldata,unsigned_short *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  ulong uVar1;
  ushort uVar2;
  ushort uVar3;
  unsigned_long *puVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  sel_t sVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (false_sel != (SelectionVector *)0x0 && true_sel != (SelectionVector *)0x0) {
    iVar7 = SelectFlatLoop<unsigned_short,unsigned_short,duckdb::GreaterThan,false,true,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
    return iVar7;
  }
  uVar1 = count + 0x3f;
  if (true_sel == (SelectionVector *)0x0) {
    if (uVar1 < 0x40) {
      lVar11 = 0;
    }
    else {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      lVar11 = 0;
      uVar13 = 0;
      uVar14 = 0;
      do {
        if (puVar4 == (unsigned_long *)0x0) {
          uVar9 = uVar14 + 0x40;
          if (count <= uVar14 + 0x40) {
            uVar9 = count;
          }
LAB_01480398:
          uVar8 = uVar14;
          if (uVar14 < uVar9) {
            psVar5 = sel->sel_vector;
            uVar2 = *rdata;
            psVar6 = false_sel->sel_vector;
            do {
              uVar15 = uVar14;
              if (psVar5 != (sel_t *)0x0) {
                uVar15 = (ulong)psVar5[uVar14];
              }
              uVar3 = ldata[uVar14];
              psVar6[lVar11] = (sel_t)uVar15;
              lVar11 = (lVar11 + 1) - (ulong)(uVar2 < uVar3);
              uVar14 = uVar14 + 1;
              uVar8 = uVar9;
            } while (uVar9 != uVar14);
          }
        }
        else {
          uVar15 = puVar4[uVar13];
          uVar9 = uVar14 + 0x40;
          if (count <= uVar14 + 0x40) {
            uVar9 = count;
          }
          if (uVar15 == 0xffffffffffffffff) goto LAB_01480398;
          uVar8 = uVar9;
          if (uVar15 == 0) {
            if (uVar14 < uVar9) {
              psVar5 = sel->sel_vector;
              psVar6 = false_sel->sel_vector;
              do {
                sVar10 = (sel_t)uVar14;
                if (psVar5 != (sel_t *)0x0) {
                  sVar10 = psVar5[uVar14];
                }
                psVar6[lVar11] = sVar10;
                lVar11 = lVar11 + 1;
                uVar14 = uVar14 + 1;
              } while (uVar9 != uVar14);
            }
          }
          else {
            uVar8 = uVar14;
            if (uVar14 < uVar9) {
              psVar5 = sel->sel_vector;
              psVar6 = false_sel->sel_vector;
              uVar12 = 0;
              do {
                if (psVar5 == (sel_t *)0x0) {
                  sVar10 = (int)uVar14 + (int)uVar12;
                }
                else {
                  sVar10 = psVar5[uVar14 + uVar12];
                }
                if ((uVar15 >> (uVar12 & 0x3f) & 1) == 0) {
                  uVar8 = 1;
                }
                else {
                  uVar8 = (ulong)(ldata[uVar14 + uVar12] <= *rdata);
                }
                psVar6[lVar11] = sVar10;
                lVar11 = lVar11 + uVar8;
                uVar12 = uVar12 + 1;
                uVar8 = uVar9;
              } while ((uVar14 - uVar9) + uVar12 != 0);
            }
          }
        }
        uVar13 = uVar13 + 1;
        uVar14 = uVar8;
      } while (uVar13 != uVar1 >> 6);
    }
    iVar7 = count - lVar11;
  }
  else if (uVar1 < 0x40) {
    iVar7 = 0;
  }
  else {
    puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar7 = 0;
    uVar13 = 0;
    uVar14 = 0;
    do {
      if (puVar4 == (unsigned_long *)0x0) {
        uVar9 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar9 = count;
        }
LAB_014802c2:
        uVar8 = uVar14;
        if (uVar14 < uVar9) {
          psVar5 = sel->sel_vector;
          uVar2 = *rdata;
          psVar6 = true_sel->sel_vector;
          do {
            uVar15 = uVar14;
            if (psVar5 != (sel_t *)0x0) {
              uVar15 = (ulong)psVar5[uVar14];
            }
            uVar3 = ldata[uVar14];
            psVar6[iVar7] = (sel_t)uVar15;
            iVar7 = iVar7 + (uVar2 < uVar3);
            uVar14 = uVar14 + 1;
            uVar8 = uVar9;
          } while (uVar9 != uVar14);
        }
      }
      else {
        uVar15 = puVar4[uVar13];
        uVar9 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar9 = count;
        }
        uVar8 = uVar9;
        if (uVar15 != 0) {
          if (uVar15 == 0xffffffffffffffff) goto LAB_014802c2;
          uVar8 = uVar14;
          if (uVar14 < uVar9) {
            psVar5 = sel->sel_vector;
            psVar6 = true_sel->sel_vector;
            uVar12 = 0;
            do {
              if (psVar5 == (sel_t *)0x0) {
                sVar10 = (int)uVar14 + (int)uVar12;
              }
              else {
                sVar10 = psVar5[uVar14 + uVar12];
              }
              if ((uVar15 >> (uVar12 & 0x3f) & 1) == 0) {
                uVar8 = 0;
              }
              else {
                uVar8 = (ulong)(*rdata < ldata[uVar14 + uVar12]);
              }
              psVar6[iVar7] = sVar10;
              iVar7 = iVar7 + uVar8;
              uVar12 = uVar12 + 1;
              uVar8 = uVar9;
            } while ((uVar14 - uVar9) + uVar12 != 0);
          }
        }
      }
      uVar13 = uVar13 + 1;
      uVar14 = uVar8;
    } while (uVar13 != uVar1 >> 6);
  }
  return iVar7;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}